

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void __thiscall absl::lts_20250127::Mutex::AssertNotHeld(Mutex *this)

{
  bool bVar1;
  OnDeadlockCycle OVar2;
  SynchLocksHeld *pSVar3;
  SynchEvent *pSVar4;
  char *local_70;
  char *absl_raw_log_internal_basename;
  SynchEvent *mu_events;
  int i;
  SynchLocksHeld *locks;
  GraphId id;
  Mutex *this_local;
  memory_order __b;
  
  id.handle = (uint64_t)this;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  if ((((this->mu_).super___atomic_base<long>._M_i & 9U) != 0) &&
     (OVar2 = std::atomic<absl::lts_20250127::OnDeadlockCycle>::load
                        ((atomic<absl::lts_20250127::OnDeadlockCycle> *)
                         &lts_20250127::(anonymous_namespace)::synch_deadlock_detection,
                         memory_order_acquire), OVar2 != kIgnore)) {
    locks = (SynchLocksHeld *)GetGraphId(this);
    pSVar3 = Synch_GetAllLocks();
    for (mu_events._4_4_ = 0; mu_events._4_4_ != pSVar3->n; mu_events._4_4_ = mu_events._4_4_ + 1) {
      bVar1 = synchronization_internal::GraphId::operator==
                        (&pSVar3->locks[mu_events._4_4_].id,(GraphId *)&locks);
      if (bVar1) {
        pSVar4 = GetSynchEvent(this);
        if (pSVar4 == (SynchEvent *)0x0) {
          local_70 = "";
        }
        else {
          local_70 = pSVar4->name;
        }
        raw_log_internal::RawLog
                  (kFatal,"mutex.cc",0x5e3,"thread should not hold mutex %p %s",this,local_70);
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                      ,0x5e3,"void absl::Mutex::AssertNotHeld() const");
      }
    }
  }
  return;
}

Assistant:

void Mutex::AssertNotHeld() const {
  // We have the data to allow this check only if in debug mode and deadlock
  // detection is enabled.
  if (kDebugMode &&
      (mu_.load(std::memory_order_relaxed) & (kMuWriter | kMuReader)) != 0 &&
      synch_deadlock_detection.load(std::memory_order_acquire) !=
          OnDeadlockCycle::kIgnore) {
    GraphId id = GetGraphId(const_cast<Mutex*>(this));
    SynchLocksHeld* locks = Synch_GetAllLocks();
    for (int i = 0; i != locks->n; i++) {
      if (locks->locks[i].id == id) {
        SynchEvent* mu_events = GetSynchEvent(this);
        ABSL_RAW_LOG(FATAL, "thread should not hold mutex %p %s",
                     static_cast<const void*>(this),
                     (mu_events == nullptr ? "" : mu_events->name));
      }
    }
  }
}